

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * sqlite3_value_blob(sqlite3_value *pVal)

{
  ushort uVar1;
  int iVar2;
  void *pvVar3;
  
  uVar1 = pVal->flags;
  if ((uVar1 & 0x12) == 0) {
    pvVar3 = sqlite3ValueText(pVal,'\x01');
    return pvVar3;
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    iVar2 = sqlite3VdbeMemExpandBlob(pVal);
    if (iVar2 != 0) {
      return (void *)0x0;
    }
    uVar1 = pVal->flags;
  }
  pVal->flags = uVar1 | 0x10;
  if (pVal->n == 0) {
    return (void *)0x0;
  }
  return pVal->z;
}

Assistant:

SQLITE_API const void *sqlite3_value_blob(sqlite3_value *pVal){
  Mem *p = (Mem*)pVal;
  if( p->flags & (MEM_Blob|MEM_Str) ){
    if( ExpandBlob(p)!=SQLITE_OK ){
      assert( p->flags==MEM_Null && p->z==0 );
      return 0;
    }
    p->flags |= MEM_Blob;
    return p->n ? p->z : 0;
  }else{
    return sqlite3_value_text(pVal);
  }
}